

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O0

void __thiscall UEFITool::readSettings(UEFITool *this)

{
  undefined8 uVar1;
  byte bVar2;
  parameter_type pVar3;
  int iVar4;
  QFont local_568 [16];
  QVariant local_558;
  QString local_538;
  QVariant local_520;
  QString local_500;
  QVariant local_4e8;
  QString local_4c8;
  QVariant local_4b0;
  QString local_490;
  int local_474;
  undefined1 local_470 [4];
  int fontSize;
  QString fontName;
  QString local_438;
  QVariant local_420;
  QVariant local_400;
  QString local_3e0;
  QVariant local_3c8;
  QVariant local_3a8;
  QString local_388;
  QVariant local_370;
  QVariant local_350;
  QString local_330;
  QVariant local_318;
  QVariant local_2f8;
  QString local_2d8;
  QVariant local_2c0;
  QVariant local_2a0;
  QString local_280;
  QVariant local_268;
  QVariant local_248;
  QString local_228;
  QVariant local_210;
  QVariant local_1f0;
  QString local_1d0;
  QVariant local_1b8;
  QVariant local_198;
  QString local_178;
  QVariant local_160;
  undefined1 local_140 [8];
  QList<int> vertList;
  QList<int> horList;
  QString local_f0;
  QVariant local_d8;
  QByteArray local_b8;
  QVariant local_a0;
  QString local_70;
  QVariant local_58;
  QByteArray local_38;
  QSettings local_20 [8];
  QSettings settings;
  UEFITool *this_local;
  
  QSettings::QSettings(local_20,(QObject *)this);
  QString::QString(&local_70,"mainWindow/geometry");
  QVariant::QVariant(&local_a0);
  QSettings::value((QString *)&local_58,(QVariant *)local_20);
  QVariant::toByteArray();
  QWidget::restoreGeometry((QByteArray *)this);
  QByteArray::~QByteArray(&local_38);
  QVariant::~QVariant(&local_58);
  QVariant::~QVariant(&local_a0);
  QString::~QString(&local_70);
  QString::QString(&local_f0,"mainWindow/windowState");
  QVariant::QVariant((QVariant *)&horList.d.size);
  QSettings::value((QString *)&local_d8,(QVariant *)local_20);
  QVariant::toByteArray();
  QMainWindow::restoreState((QByteArray *)this,(int)&local_b8);
  QByteArray::~QByteArray(&local_b8);
  QVariant::~QVariant(&local_d8);
  QVariant::~QVariant((QVariant *)&horList.d.size);
  QString::~QString(&local_f0);
  QList<int>::QList((QList<int> *)&vertList.d.size);
  QList<int>::QList((QList<int> *)local_140);
  QString::QString(&local_178,"mainWindow/treeWidth");
  QVariant::QVariant(&local_198,600);
  QSettings::value((QString *)&local_160,(QVariant *)local_20);
  pVar3 = QVariant::toInt((bool *)&local_160);
  QList<int>::append((QList<int> *)&vertList.d.size,pVar3);
  QVariant::~QVariant(&local_160);
  QVariant::~QVariant(&local_198);
  QString::~QString(&local_178);
  QString::QString(&local_1d0,"mainWindow/infoWidth");
  QVariant::QVariant(&local_1f0,0xb4);
  QSettings::value((QString *)&local_1b8,(QVariant *)local_20);
  pVar3 = QVariant::toInt((bool *)&local_1b8);
  QList<int>::append((QList<int> *)&vertList.d.size,pVar3);
  QVariant::~QVariant(&local_1b8);
  QVariant::~QVariant(&local_1f0);
  QString::~QString(&local_1d0);
  QString::QString(&local_228,"mainWindow/treeHeight");
  QVariant::QVariant(&local_248,400);
  QSettings::value((QString *)&local_210,(QVariant *)local_20);
  pVar3 = QVariant::toInt((bool *)&local_210);
  QList<int>::append((QList<int> *)local_140,pVar3);
  QVariant::~QVariant(&local_210);
  QVariant::~QVariant(&local_248);
  QString::~QString(&local_228);
  QString::QString(&local_280,"mainWindow/messageHeight");
  QVariant::QVariant(&local_2a0,0xb4);
  QSettings::value((QString *)&local_268,(QVariant *)local_20);
  pVar3 = QVariant::toInt((bool *)&local_268);
  QList<int>::append((QList<int> *)local_140,pVar3);
  QVariant::~QVariant(&local_268);
  QVariant::~QVariant(&local_2a0);
  QString::~QString(&local_280);
  QSplitter::setSizes(*(QList_conflict **)(this->ui + 0x118));
  QSplitter::setSizes(*(QList_conflict **)(this->ui + 0x110));
  uVar1 = *(undefined8 *)(this->ui + 0x130);
  QString::QString(&local_2d8,"tree/columnWidth0");
  iVar4 = QTreeView::columnWidth((int)*(undefined8 *)(this->ui + 0x130));
  QVariant::QVariant(&local_2f8,iVar4);
  QSettings::value((QString *)&local_2c0,(QVariant *)local_20);
  QVariant::toInt((bool *)&local_2c0);
  QTreeView::setColumnWidth((int)uVar1,0);
  QVariant::~QVariant(&local_2c0);
  QVariant::~QVariant(&local_2f8);
  QString::~QString(&local_2d8);
  uVar1 = *(undefined8 *)(this->ui + 0x130);
  QString::QString(&local_330,"tree/columnWidth1");
  iVar4 = QTreeView::columnWidth((int)*(undefined8 *)(this->ui + 0x130));
  QVariant::QVariant(&local_350,iVar4);
  QSettings::value((QString *)&local_318,(QVariant *)local_20);
  QVariant::toInt((bool *)&local_318);
  QTreeView::setColumnWidth((int)uVar1,1);
  QVariant::~QVariant(&local_318);
  QVariant::~QVariant(&local_350);
  QString::~QString(&local_330);
  uVar1 = *(undefined8 *)(this->ui + 0x130);
  QString::QString(&local_388,"tree/columnWidth2");
  iVar4 = QTreeView::columnWidth((int)*(undefined8 *)(this->ui + 0x130));
  QVariant::QVariant(&local_3a8,iVar4);
  QSettings::value((QString *)&local_370,(QVariant *)local_20);
  QVariant::toInt((bool *)&local_370);
  QTreeView::setColumnWidth((int)uVar1,2);
  QVariant::~QVariant(&local_370);
  QVariant::~QVariant(&local_3a8);
  QString::~QString(&local_388);
  uVar1 = *(undefined8 *)(this->ui + 0x130);
  QString::QString(&local_3e0,"tree/columnWidth3");
  iVar4 = QTreeView::columnWidth((int)*(undefined8 *)(this->ui + 0x130));
  QVariant::QVariant(&local_400,iVar4);
  QSettings::value((QString *)&local_3c8,(QVariant *)local_20);
  QVariant::toInt((bool *)&local_3c8);
  QTreeView::setColumnWidth((int)uVar1,3);
  QVariant::~QVariant(&local_3c8);
  QVariant::~QVariant(&local_400);
  QString::~QString(&local_3e0);
  QString::QString(&local_438,"tree/markingEnabled");
  QVariant::QVariant((QVariant *)&fontName.d.size,true);
  QSettings::value((QString *)&local_420,(QVariant *)local_20);
  bVar2 = QVariant::toBool();
  this->markingEnabled = (bool)(bVar2 & 1);
  QVariant::~QVariant(&local_420);
  QVariant::~QVariant((QVariant *)&fontName.d.size);
  QString::~QString(&local_438);
  QAction::setChecked(SUB81(*(undefined8 *)(this->ui + 0xd8),0));
  QString::QString((QString *)local_470);
  QString::QString(&local_4c8,"mainWindow/fontName");
  QString::QString(&local_500,"Courier New");
  QVariant::QVariant(&local_4e8,(QString *)&local_500);
  QSettings::value((QString *)&local_4b0,(QVariant *)local_20);
  QVariant::toString();
  QString::operator=((QString *)local_470,&local_490);
  QString::~QString(&local_490);
  QVariant::~QVariant(&local_4b0);
  QVariant::~QVariant(&local_4e8);
  QString::~QString(&local_500);
  QString::~QString(&local_4c8);
  QString::QString(&local_538,"mainWindow/fontSize");
  QVariant::QVariant(&local_558,10);
  QSettings::value((QString *)&local_520,(QVariant *)local_20);
  local_474 = QVariant::toInt((bool *)&local_520);
  QVariant::~QVariant(&local_520);
  QVariant::~QVariant(&local_558);
  QString::~QString(&local_538);
  QFont::QFont(local_568,(QString *)local_470,local_474,-1,false);
  QFont::operator=(&this->currentFont,local_568);
  QFont::~QFont(local_568);
  QFont::setStyleHint(&this->currentFont,7,1);
  QApplication::setFont(&this->currentFont,(char *)0x0);
  QString::~QString((QString *)local_470);
  QList<int>::~QList((QList<int> *)local_140);
  QList<int>::~QList((QList<int> *)&vertList.d.size);
  QSettings::~QSettings(local_20);
  return;
}

Assistant:

void UEFITool::readSettings()
{
    QSettings settings(this);
    restoreGeometry(settings.value("mainWindow/geometry").toByteArray());
    restoreState(settings.value("mainWindow/windowState").toByteArray());
    QList<int> horList, vertList;
    horList.append(settings.value("mainWindow/treeWidth", 600).toInt());
    horList.append(settings.value("mainWindow/infoWidth", 180).toInt());
    vertList.append(settings.value("mainWindow/treeHeight", 400).toInt());
    vertList.append(settings.value("mainWindow/messageHeight", 180).toInt());
    ui->infoSplitter->setSizes(horList);
    ui->messagesSplitter->setSizes(vertList);
    ui->structureTreeView->setColumnWidth(0, settings.value("tree/columnWidth0", ui->structureTreeView->columnWidth(0)).toInt());
    ui->structureTreeView->setColumnWidth(1, settings.value("tree/columnWidth1", ui->structureTreeView->columnWidth(1)).toInt());
    ui->structureTreeView->setColumnWidth(2, settings.value("tree/columnWidth2", ui->structureTreeView->columnWidth(2)).toInt());
    ui->structureTreeView->setColumnWidth(3, settings.value("tree/columnWidth3", ui->structureTreeView->columnWidth(3)).toInt());
    markingEnabled = settings.value("tree/markingEnabled", true).toBool();
    ui->actionToggleBootGuardMarking->setChecked(markingEnabled);
    
    // Set monospace font
    QString fontName;
    int fontSize;
#if defined Q_OS_MACOS
    fontName = settings.value("mainWindow/fontName", QString("Menlo")).toString();
    fontSize = settings.value("mainWindow/fontSize", 10).toInt();
#elif defined Q_OS_WIN
    fontName = settings.value("mainWindow/fontName", QString("Consolas")).toString();
    fontSize = settings.value("mainWindow/fontSize", 9).toInt();
#else
    fontName = settings.value("mainWindow/fontName", QString("Courier New")).toString();
    fontSize = settings.value("mainWindow/fontSize", 10).toInt();
#endif
    currentFont = QFont(fontName, fontSize);
    currentFont.setStyleHint(QFont::Monospace);
    QApplication::setFont(currentFont);
}